

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cDirectStateAccessTexturesTests.cpp
# Opt level: O1

bool __thiscall
gl4cts::DirectStateAccess::Textures::SubImageErrorsTest::Test2DCompressed(SubImageErrorsTest *this)

{
  bool bVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  int iVar5;
  deUint32 dVar6;
  undefined4 extraout_var;
  ErrorsUtilities *pEVar8;
  long lVar7;
  
  iVar5 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar7 = CONCAT44(extraout_var,iVar5);
  if (this->m_reference_compressed_2D == (GLubyte *)0x0) {
    bVar1 = true;
  }
  else {
    pEVar8 = (ErrorsUtilities *)(ulong)this->m_to_invalid;
    (**(code **)(lVar7 + 0x2e8))
              (pEVar8,0,0,0,4,4,this->m_reference_compressed_2D_format,
               this->m_reference_compressed_2D_size,this->m_reference_compressed_2D);
    bVar1 = ErrorsUtilities::CheckErrorAndLog
                      (pEVar8,(this->super_TestCase).m_context,0x502,"glCompressedTextureSubImage2D"
                       ,"texture is not the name of an existing texture object.");
    pEVar8 = (ErrorsUtilities *)(ulong)this->m_to_2D_compressed;
    (**(code **)(lVar7 + 0x2e8))
              (pEVar8,0,0,0,4,4,0x8226,this->m_reference_compressed_2D_size,
               this->m_reference_compressed_2D);
    bVar2 = ErrorsUtilities::CheckErrorAndLog
                      (pEVar8,(this->super_TestCase).m_context,0x500,"glCompressedTextureSubImage2D"
                       ,
                       "internalformat is of the generic compressed internal formats: COMPRESSED_RED, COMPRESSED_RG, COMPRESSED_RGB, COMPRESSED_RGBA. COMPRESSED_SRGB, or COMPRESSED_SRGB_ALPHA."
                      );
    pEVar8 = (ErrorsUtilities *)(ulong)this->m_to_2D_compressed;
    (**(code **)(lVar7 + 0x2e8))
              (pEVar8,0,0,0,4,4,this->m_format_compressed_not_matching,
               this->m_reference_compressed_2D_size,this->m_reference_compressed_2D);
    bVar3 = ErrorsUtilities::CheckErrorAndLog
                      (pEVar8,(this->super_TestCase).m_context,0x502,"glCompressedTextureSubImage2D"
                       ,
                       "format does not match the internal format of the texture image being modified, since these commands do not provide for image format conversion."
                      );
    pEVar8 = (ErrorsUtilities *)(ulong)this->m_to_2D_compressed;
    (**(code **)(lVar7 + 0x2e8))
              (pEVar8,0,0,0,4,4,this->m_reference_compressed_2D_format,
               this->m_reference_compressed_2D_size + -1,this->m_reference_compressed_2D);
    bVar4 = ErrorsUtilities::CheckErrorAndLog
                      (pEVar8,(this->super_TestCase).m_context,0x501,"glCompressedTextureSubImage2D"
                       ,
                       "imageSize is not consistent with the format, dimensions, and contents of the specified compressed image data."
                      );
    bVar2 = (bVar4 && bVar3) && (bVar2 && bVar1);
    (**(code **)(lVar7 + 0x40))(0x88ec,this->m_bo);
    dVar6 = (**(code **)(lVar7 + 0x800))();
    glu::checkError(dVar6,"glBindBuffer has failed",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessTexturesTests.cpp"
                    ,0x2884);
    (**(code **)(lVar7 + 0xcf8))(0x88ec,0x88ba);
    iVar5 = (**(code **)(lVar7 + 0x800))();
    if (iVar5 == 0) {
      pEVar8 = (ErrorsUtilities *)(ulong)this->m_to_2D_compressed;
      (**(code **)(lVar7 + 0x2e8))
                (pEVar8,0,0,0,4,4,this->m_reference_compressed_2D_format,
                 this->m_reference_compressed_2D_size,0);
      bVar1 = ErrorsUtilities::CheckErrorAndLog
                        (pEVar8,(this->super_TestCase).m_context,0x502,
                         "glCompressedTextureSubImage2D",
                         "a non-zero buffer object name is bound to the PIXEL_UNPACK_BUFFER target and the buffer object\'s data store is currently mapped."
                        );
      bVar2 = bVar2 && bVar1;
      (**(code **)(lVar7 + 0x1670))(0x88ec);
      dVar6 = (**(code **)(lVar7 + 0x800))();
      glu::checkError(dVar6,"glBindBuffer has failed",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessTexturesTests.cpp"
                      ,0x2891);
      (**(code **)(lVar7 + 0x40))(0x88ec,0);
      dVar6 = (**(code **)(lVar7 + 0x800))();
      glu::checkError(dVar6,"glBindBuffer has failed",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessTexturesTests.cpp"
                      ,0x2894);
    }
    (**(code **)(lVar7 + 0x40))(0x88ec,this->m_bo);
    dVar6 = (**(code **)(lVar7 + 0x800))();
    glu::checkError(dVar6,"glBindBuffer has failed",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessTexturesTests.cpp"
                    ,0x289e);
    pEVar8 = (ErrorsUtilities *)(ulong)this->m_to_2D_compressed;
    (**(code **)(lVar7 + 0x2e8))
              (pEVar8,0,0,0,4,4,this->m_reference_compressed_2D_format,
               this->m_reference_compressed_2D_size,0x400);
    bVar1 = ErrorsUtilities::CheckErrorAndLog
                      (pEVar8,(this->super_TestCase).m_context,0x502,"glCompressedTextureSubImage2D"
                       ,
                       "a non-zero buffer object name is bound to the PIXEL_UNPACK_BUFFER target and the buffer object\'s data store is currently mapped."
                      );
    bVar1 = (bool)(bVar1 & bVar2);
    (**(code **)(lVar7 + 0x40))(0x88ec,0);
    dVar6 = (**(code **)(lVar7 + 0x800))();
    glu::checkError(dVar6,"glBindBuffer has failed",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessTexturesTests.cpp"
                    ,0x28a8);
    if (this->m_reference_compressed_rectangle != (GLubyte *)0x0) {
      pEVar8 = (ErrorsUtilities *)(ulong)this->m_to_rectangle_compressed;
      (**(code **)(lVar7 + 0x2e8))
                (pEVar8,0,0,0,4,4,this->m_reference_compressed_rectangle_format,
                 this->m_reference_compressed_rectangle_size,this->m_reference_compressed_rectangle)
      ;
      bVar2 = ErrorsUtilities::CheckErrorAndLog
                        (pEVar8,(this->super_TestCase).m_context,0x502,
                         "glCompressedTextureSubImage2D",
                         "texture is not the name of an existing texture object.");
      bVar1 = (bool)(bVar1 & bVar2);
    }
  }
  return bVar1;
}

Assistant:

bool SubImageErrorsTest::Test2DCompressed()
{
	/* Shortcut for GL functionality. */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Result. */
	bool is_ok = true;

	/* Do tests only if compressed 2D textures are supported. */
	if (DE_NULL != m_reference_compressed_2D)
	{
		/* Check that INVALID_OPERATION is generated by CompressedTextureSubImage2D
		 if texture is not the name of an existing texture object. */
		{
			gl.compressedTextureSubImage2D(m_to_invalid, 0, 0, 0, s_reference_width, s_reference_height,
										   m_reference_compressed_2D_format, m_reference_compressed_2D_size,
										   m_reference_compressed_2D);
			is_ok &= CheckErrorAndLog(m_context, GL_INVALID_OPERATION, "glCompressedTextureSubImage2D",
									  "texture is not the name of an existing texture object.");
		}

		/* Check that INVALID_ENUM is generated by CompressedTextureSubImage2D if
		 internalformat is of the generic compressed internal formats:
		 COMPRESSED_RED, COMPRESSED_RG, COMPRESSED_RGB, COMPRESSED_RGBA.
		 COMPRESSED_SRGB, or COMPRESSED_SRGB_ALPHA. */
		{
			gl.compressedTextureSubImage2D(m_to_2D_compressed, 0, 0, 0, s_reference_width, s_reference_height,
										   GL_COMPRESSED_RG, m_reference_compressed_2D_size, m_reference_compressed_2D);
			is_ok &= CheckErrorAndLog(m_context, GL_INVALID_ENUM, "glCompressedTextureSubImage2D",
									  "internalformat is of the generic compressed internal formats: COMPRESSED_RED, "
									  "COMPRESSED_RG, COMPRESSED_RGB, COMPRESSED_RGBA. COMPRESSED_SRGB, or "
									  "COMPRESSED_SRGB_ALPHA.");
		}

		/* Check that INVALID_OPERATION is generated if format does not match the
		 internal format of the texture image being modified, since these
		 commands do not provide for image format conversion. */
		{
			gl.compressedTextureSubImage2D(m_to_2D_compressed, 0, 0, 0, s_reference_width, s_reference_height,
										   m_format_compressed_not_matching, m_reference_compressed_2D_size,
										   m_reference_compressed_2D);
			is_ok &= CheckErrorAndLog(m_context, GL_INVALID_OPERATION, "glCompressedTextureSubImage2D",
									  "format does not match the internal format of the texture image being modified, "
									  "since these commands do not provide for image format conversion.");
		}

		/* Check that INVALID_VALUE is generated by CompressedTextureSubImage2D if
		 imageSize is not consistent with the format, dimensions, and contents of
		 the specified compressed image data. */
		{
			gl.compressedTextureSubImage2D(m_to_2D_compressed, 0, 0, 0, s_reference_width, s_reference_height,
										   m_reference_compressed_2D_format, m_reference_compressed_2D_size - 1,
										   m_reference_compressed_2D);
			is_ok &= CheckErrorAndLog(m_context, GL_INVALID_VALUE, "glCompressedTextureSubImage2D",
									  "imageSize is not consistent with the format, dimensions, and contents of the "
									  "specified compressed image data.");
		}

		/* Check that INVALID_OPERATION is generated by CompressedTextureSubImage2D
		 if a non-zero buffer object name is bound to the PIXEL_UNPACK_BUFFER
		 target and the buffer object's data store is currently mapped. */
		{
			gl.bindBuffer(GL_PIXEL_UNPACK_BUFFER, m_bo);
			GLU_EXPECT_NO_ERROR(gl.getError(), "glBindBuffer has failed");

			gl.mapBuffer(GL_PIXEL_UNPACK_BUFFER, GL_READ_WRITE);

			if (GL_NO_ERROR == gl.getError())
			{
				gl.compressedTextureSubImage2D(m_to_2D_compressed, 0, 0, 0, s_reference_width, s_reference_height,
											   m_reference_compressed_2D_format, m_reference_compressed_2D_size, NULL);
				is_ok &= CheckErrorAndLog(m_context, GL_INVALID_OPERATION, "glCompressedTextureSubImage2D",
										  "a non-zero buffer object name is bound to the PIXEL_UNPACK_BUFFER target "
										  "and the buffer object's data store is currently mapped.");

				gl.unmapBuffer(GL_PIXEL_UNPACK_BUFFER);
				GLU_EXPECT_NO_ERROR(gl.getError(), "glBindBuffer has failed");

				gl.bindBuffer(GL_PIXEL_UNPACK_BUFFER, 0);
				GLU_EXPECT_NO_ERROR(gl.getError(), "glBindBuffer has failed");
			}
		}

		/* Check that INVALID_OPERATION is generated by CompressedTextureSubImage2D
		 if a non-zero buffer object name is bound to the PIXEL_UNPACK_BUFFER
		 target and the data would be unpacked from the buffer object such that
		 the memory reads required would exceed the data store size. */
		{
			gl.bindBuffer(GL_PIXEL_UNPACK_BUFFER, m_bo);
			GLU_EXPECT_NO_ERROR(gl.getError(), "glBindBuffer has failed");

			gl.compressedTextureSubImage2D(m_to_2D_compressed, 0, 0, 0, s_reference_width, s_reference_height,
										   m_reference_compressed_2D_format, m_reference_compressed_2D_size,
										   (glw::GLubyte*)NULL + s_reference_size * 2);
			is_ok &= CheckErrorAndLog(m_context, GL_INVALID_OPERATION, "glCompressedTextureSubImage2D",
									  "a non-zero buffer object name is bound to the PIXEL_UNPACK_BUFFER target and "
									  "the buffer object's data store is currently mapped.");

			gl.bindBuffer(GL_PIXEL_UNPACK_BUFFER, 0);
			GLU_EXPECT_NO_ERROR(gl.getError(), "glBindBuffer has failed");
		}

		/* Check that INVALID_OPERATION is generated by CompressedTextureSubImage2D
		 if the effective target is TEXTURE_RECTANGLE. */
		if (DE_NULL !=
			m_reference_compressed_rectangle) /* Do test only if rectangle compressed texture is supported by the implementation. */
		{
			gl.compressedTextureSubImage2D(m_to_rectangle_compressed, 0, 0, 0, s_reference_width, s_reference_height,
										   m_reference_compressed_rectangle_format,
										   m_reference_compressed_rectangle_size, m_reference_compressed_rectangle);
			is_ok &= CheckErrorAndLog(m_context, GL_INVALID_OPERATION, "glCompressedTextureSubImage2D",
									  "texture is not the name of an existing texture object.");
		}
	}

	return is_ok;
}